

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marketgenerator.cpp
# Opt level: O1

void __thiscall hedg::MarketGenerator::poll_within(MarketGenerator *this,int time1,int time2)

{
  _Elt_pointer ppVar1;
  pointer pcVar2;
  int iVar3;
  int *piVar4;
  double dVar5;
  string time_now;
  string local_98;
  string local_78;
  long *local_58;
  long local_50;
  long local_48 [2];
  timespec local_38;
  
  wait_for_gen(this);
  Timing::now_abi_cxx11_();
  ppVar1 = (this->markets_).c.
           super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pcVar2 = (ppVar1->second).market_start_time_._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,
             pcVar2 + (ppVar1->second).market_start_time_._M_string_length);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_58,local_50 + (long)local_58);
  dVar5 = Timing::time_diff_mins(&local_78,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((dVar5 < (double)time1) || ((double)time2 < dVar5)) {
    if (dVar5 < (double)time1) {
      std::
      deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
      ::pop_front(&(this->markets_).c);
    }
    local_38.tv_sec = 10;
    local_38.tv_nsec = 0;
    do {
      iVar3 = nanosleep(&local_38,&local_38);
      if (iVar3 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

void MarketGenerator::poll_within(int time1, int time2) {

	wait_for_gen();
	std::string time_now = Timing::now();
	double diff = Timing::time_diff_mins(markets_.front().second.market_start_time_, time_now);
	if (diff >= time1 && diff <= time2)
		return;
	if (diff < time1) {
		markets_.pop();
	}
	std::this_thread::sleep_for(std::chrono::duration(std::chrono::seconds(10)));
}